

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O3

bool __thiscall
ParsePackage::ParseFuncCall
          (ParsePackage *this,char *buf,int len,string *func_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_str_map,vector<cppnet::Any,_std::allocator<cppnet::Any>_> *res)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  const_iterator cVar6;
  long lVar7;
  ParsePackage *this_00;
  ParsePackage *pPVar8;
  int iVar9;
  string func_str;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  _Base_ptr local_38;
  
  if (buf == (char *)0x0) {
    return false;
  }
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  iVar3 = strcmp(buf,"\r\n\r\n");
  if (iVar3 == 0) {
    return true;
  }
  pPVar8 = (ParsePackage *)(buf + len);
  local_38 = &(func_str_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
  iVar9 = 2;
  lVar7 = 0;
  iVar3 = 0;
LAB_0010a78d:
  if ((pPVar8 < buf) ||
     (this_00 = (ParsePackage *)buf, pcVar5 = strchr(buf,0x7c), pcVar5 == (char *)0x0))
  goto LAB_0010a8d1;
  *pcVar5 = '\0';
  if (iVar9 != 4) {
    if (iVar9 == 3) {
      iVar3 = atoi(buf);
      iVar9 = 4;
    }
    else {
      pcVar1 = (char *)func_name->_M_string_length;
      strlen(buf);
      std::__cxx11::string::_M_replace((ulong)func_name,0,pcVar1,(ulong)buf);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&func_str_map->_M_t,func_name);
      if (cVar6._M_node == local_38) goto LAB_0010a8d1;
      std::__cxx11::string::_M_assign((string *)&local_58);
      lVar7 = std::__cxx11::string::find((char *)&local_58,0x1222e6,0);
      lVar7 = lVar7 + 1;
      iVar9 = 3;
    }
LAB_0010a8ac:
    buf = pcVar5 + 1;
    iVar4 = strcmp(buf,"\r\n\r\n");
    if (iVar4 == 0) {
LAB_0010a8c9:
      bVar2 = true;
LAB_0010a8d3:
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      return bVar2;
    }
    goto LAB_0010a78d;
  }
  if (local_58[lVar7] == 'v') {
    bVar2 = _ParseVec(this_00,buf,local_58[lVar7 + 1],res);
    if (bVar2) {
      lVar7 = lVar7 + 2;
LAB_0010a894:
      iVar9 = 4;
      iVar3 = iVar3 + -1;
      if (iVar3 != 0) goto LAB_0010a8ac;
      if (local_58[lVar7] == ')') goto LAB_0010a8c9;
      iVar3 = 0;
      goto LAB_0010a8ac;
    }
  }
  else {
    bVar2 = _ParseParam(this_00,buf,local_58[lVar7],res);
    if (bVar2) {
      lVar7 = lVar7 + 1;
      goto LAB_0010a894;
    }
  }
LAB_0010a8d1:
  bVar2 = false;
  goto LAB_0010a8d3;
}

Assistant:

bool ParsePackage::ParseFuncCall(char* buf, int len, std::string& func_name, const std::map<std::string, std::string>& func_str_map, std::vector<cppnet::Any>& res) {
    if (!buf) {
        return false;
    }
    char* end = buf + len;
    char* next = buf;
    char* pos = nullptr;
    char* cur = nullptr;

    int state = PARSE_NAME;
    int num = 0;
    std::string func_str;
    size_t index = 0;
    for (;;) {
        cur = next;
        if (strcmp(cur, "\r\n\r\n") == 0) {
            return true;
        }
        if (cur > end) {
            return false;
        }
        pos = strchr(cur, '|');
        if (pos) {
            next = pos + 1;
            *pos = '\0';

        } else {
            return false;
        }
        switch (state) {
        case PARSE_NAME:
        {
            func_name = cur;
            auto iter = func_str_map.find(func_name);
            if (iter != func_str_map.end()) {
                func_str = iter->second;
                state = PARSE_NUM;
                index = func_str.find("(") + 1;
                break;
            }
            return false;
        }
            
        case PARSE_NUM:
            num = atoi(cur);
            state = PARSE_PARAM;
            break;
        case PARSE_PARAM:
            if (func_str[index] == 'v') {
                if (_ParseVec(cur, func_str[++index], res)) {
                    num--;
                    index++;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            } else {
                if (_ParseParam(cur, func_str[index++], res)) {
                    num--;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            }
            break;
        }
    }
    return false;
}